

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::createReferenceProgram
          (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           *__return_storage_ptr__,SeparateShaderTest *this,ProgramParams *pp)

{
  deUint32 dVar1;
  ProgramWrapper *pPVar2;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  double __x;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  MessageBuilder local_260;
  uint local_e0;
  undefined1 local_da;
  allocator<char> local_d9;
  GLuint progName;
  undefined1 local_b8 [8];
  string frgSrc;
  allocator<char> local_81;
  string local_80;
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> local_60;
  undefined1 local_48 [8];
  string vtxSrc;
  bool useUniform;
  ProgramParams *pp_local;
  SeparateShaderTest *this_local;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *program;
  
  vtxSrc.field_2._M_local_buf[0xf] = (this->m_params).useUniform & 1;
  dVar1 = pp->vtxSeed;
  varyingCompatVtxOutputs(&local_60,&this->m_varyings);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"vtxScale",&local_81);
  genVtxShaderSrc((string *)local_48,dVar1,&local_60,&local_80,
                  (bool)(vtxSrc.field_2._M_local_buf[0xf] & 1),pp->vtxScale);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::~vector
            (&local_60);
  dVar1 = pp->frgSeed;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&progName,"frgScale",&local_d9);
  genFrgShaderSrc((string *)local_b8,dVar1,&(this->m_varyings).frgInputs,(string *)&progName,
                  (bool)(vtxSrc.field_2._M_local_buf[0xf] & 1),pp->frgScale);
  std::__cxx11::string::~string((string *)&progName);
  std::allocator<char>::~allocator(&local_d9);
  local_da = 0;
  createShaderProgram(__return_storage_ptr__,this,(string *)local_48,(string *)local_b8,false);
  pPVar2 = de::details::
           UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           ::operator->(&__return_storage_ptr__->
                         super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                       );
  local_e0 = (*pPVar2->_vptr_ProgramWrapper[2])();
  log(this,__x);
  tcu::TestLog::operator<<(&local_260,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_260,(char (*) [38])"// Created monolithic shader program ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_e0);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_260);
  if ((vtxSrc.field_2._M_local_buf[0xf] & 1U) != 0) {
    pPVar2 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator*(&__return_storage_ptr__->
                          super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                        );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"vtxScale",&local_281);
    setUniform(this,pPVar2,&local_280,pp->vtxScale,false);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    pPVar2 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator*(&__return_storage_ptr__->
                          super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                        );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"frgScale",&local_2a9);
    setUniform(this,pPVar2,&local_2a8,pp->frgScale,false);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
  }
  local_da = 1;
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ProgramWrapper> SeparateShaderTest::createReferenceProgram (const ProgramParams& pp)
{
	bool					useUniform	= m_params.useUniform;
	const string			vtxSrc		= genVtxShaderSrc(pp.vtxSeed,
														  varyingCompatVtxOutputs(m_varyings),
														  "vtxScale", useUniform, pp.vtxScale);
	const string			frgSrc		= genFrgShaderSrc(pp.frgSeed, m_varyings.frgInputs,
														  "frgScale", useUniform, pp.frgScale);
	MovePtr<ProgramWrapper>	program		= createShaderProgram(&vtxSrc, &frgSrc, false);
	GLuint					progName	= program->getProgramName();

	log() << TestLog::Message
		  << "// Created monolithic shader program " << progName
		  << TestLog::EndMessage;

	if (useUniform)
	{
		setUniform(*program, "vtxScale", pp.vtxScale, false);
		setUniform(*program, "frgScale", pp.frgScale, false);
	}

	return program;
}